

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

bool QMetaMethod::invokeImpl
               (QMetaMethod self,void *target,ConnectionType connectionType,qsizetype paramCount,
               void **parameters,char **typeNames,QMetaTypeInterface **metaTypes)

{
  long lVar1;
  InvokeFailReason IVar2;
  char *pcVar3;
  char *pcVar4;
  long in_RDX;
  long in_RDI;
  uint in_R8D;
  long in_FS_OFFSET;
  QMetaObject *in_stack_00000008;
  long in_stack_00000010;
  void **in_stack_00000020;
  ConnectionType in_stack_0000002c;
  void *in_stack_00000030;
  int n;
  InvokeFailReason r;
  qsizetype in_stack_00000238;
  QMetaMethod in_stack_00000240;
  char **in_stack_00000260;
  QMetaTypeInterface **in_stack_00000268;
  QMetaObject *this;
  long lVar5;
  QMetaMethod *in_stack_fffffffffffffec8;
  QMessageLogger *in_stack_fffffffffffffed0;
  QMetaObject *local_e0;
  bool local_99;
  QMessageLogger local_80;
  int line;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDX == 0) || (in_RDI == 0)) {
    local_99 = false;
  }
  else {
    this = in_stack_00000008;
    lVar5 = in_stack_00000010;
    IVar2 = QMetaMethodInvoker::invokeImpl
                      (in_stack_00000240,in_stack_00000030,in_stack_0000002c,in_stack_00000238,
                       in_stack_00000020,in_stack_00000260,in_stack_00000268);
    line = (int)((ulong)lVar5 >> 0x20);
    if (IVar2 == None) {
      local_99 = true;
    }
    else {
      if (~CouldNotQueueParameter < IVar2) {
        QMessageLogger::QMessageLogger
                  (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,line,(char *)this);
        if ((&(in_stack_00000008->d).superdata)[IVar2 + (CouldNotQueueParameter|TooFewArguments)].
            direct == (QMetaObject *)0x0) {
          local_e0 = *(QMetaObject **)
                      (*(long *)(in_stack_00000010 +
                                (long)(IVar2 + (CouldNotQueueParameter|TooFewArguments)) * 8) + 0x18
                      );
        }
        else {
          local_e0 = (&(in_stack_00000008->d).superdata)
                     [IVar2 + (CouldNotQueueParameter|TooFewArguments)].direct;
        }
        pcVar3 = QMetaObject::className(this);
        methodSignature(in_stack_fffffffffffffec8);
        pcVar4 = QByteArray::constData((QByteArray *)0x363847);
        QMessageLogger::warning
                  ((QMessageLogger *)&stack0xffffffffffffffb8,
                   "QMetaMethod::invoke: cannot convert formal parameter %d from %s in call to %s::%s"
                   ,(ulong)(uint)(IVar2 + CouldNotQueueParameter),local_e0,pcVar3,pcVar4);
        QByteArray::~QByteArray((QByteArray *)0x36387d);
      }
      if (IVar2 == TooFewArguments) {
        QMessageLogger::QMessageLogger
                  (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,line,(char *)this);
        pcVar3 = QMetaObject::className(this);
        methodSignature(in_stack_fffffffffffffec8);
        pcVar4 = QByteArray::constData((QByteArray *)0x36390f);
        QMessageLogger::warning
                  (&local_80,"QMetaMethod::invoke: too few arguments (%d) in call to %s::%s",
                   (ulong)in_R8D,pcVar3,pcVar4);
        QByteArray::~QByteArray((QByteArray *)0x36393f);
      }
      local_99 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_99;
  }
  __stack_chk_fail();
}

Assistant:

bool QMetaMethod::invokeImpl(QMetaMethod self, void *target, Qt::ConnectionType connectionType,
                             qsizetype paramCount, const void *const *parameters,
                             const char *const *typeNames,
                             const QtPrivate::QMetaTypeInterface *const *metaTypes)
{
    if (!target || !self.mobj)
        return false;
    QMetaMethodPrivate::InvokeFailReason r =
            QMetaMethodPrivate::invokeImpl(self, target, connectionType, paramCount, parameters,
                                           typeNames, metaTypes);
    if (Q_LIKELY(r == QMetaMethodPrivate::InvokeFailReason::None))
        return true;

    if (int(r) >= int(QMetaMethodPrivate::InvokeFailReason::FormalParameterMismatch)) {
        int n = int(r) - int(QMetaMethodPrivate::InvokeFailReason::FormalParameterMismatch);
        qWarning("QMetaMethod::invoke: cannot convert formal parameter %d from %s in call to %s::%s",
                 n, typeNames[n + 1] ? typeNames[n + 1] : metaTypes[n + 1]->name,
                 self.mobj->className(), self.methodSignature().constData());
    }
    if (r == QMetaMethodPrivate::InvokeFailReason::TooFewArguments) {
        qWarning("QMetaMethod::invoke: too few arguments (%d) in call to %s::%s",
                 int(paramCount), self.mobj->className(), self.methodSignature().constData());
    }
    return false;
}